

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getbyhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *self;
  SQRESULT SVar2;
  SQObjectValue *pSVar3;
  SQObjectPtr local_28;
  SQObjectPtr *val;
  
  self = stack_get(v,idx);
  val = (SQObjectPtr *)0x0;
  SVar2 = _getmemberbyhandle(v,self,handle,&val);
  if (SVar2 < 0) {
    SVar2 = -1;
  }
  else {
    local_28.super_SQObject._type = (val->super_SQObject)._type;
    pSVar3 = &(val->super_SQObject)._unVal;
    if (local_28.super_SQObject._type == OT_WEAKREF) {
      local_28.super_SQObject._type = *(SQObjectType *)&pSVar3->pString->_sharedstate;
      pSVar3 = (SQObjectValue *)&pSVar3->pString->_next;
    }
    local_28.super_SQObject._unVal.pWeakRef = (SQWeakRef *)pSVar3->pTable;
    if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_28);
    SQObjectPtr::~SQObjectPtr(&local_28);
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_getbyhandle(HSQUIRRELVM v,SQInteger idx,const HSQMEMBERHANDLE *handle)
{
    SQObjectPtr &self = stack_get(v,idx);
    SQObjectPtr *val = NULL;
    if(SQ_FAILED(_getmemberbyhandle(v,self,handle,val))) {
        return SQ_ERROR;
    }
    v->Push(_realval(*val));
    return SQ_OK;
}